

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-sampling.cpp
# Opt level: O0

void bench(llama_sampler *cnstr,char *cnstr_name,
          vector<llama_token_data,_std::allocator<llama_token_data>_> *data,int n_iter)

{
  __normal_iterator<const_llama_token_data_*,_std::vector<llama_token_data,_std::allocator<llama_token_data>_>_>
  __first;
  __normal_iterator<llama_token_data_*,_std::vector<llama_token_data,_std::allocator<llama_token_data>_>_>
  __last;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *this;
  long lVar1;
  int in_ECX;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  int64_t t_end;
  llama_token_data_array cur_p_1;
  int i;
  int64_t t_start;
  llama_token_data_array cur_p;
  vector<llama_token_data,_std::allocator<llama_token_data>_> cur;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *in_stack_fffffffffffffed8;
  allocator_type *in_stack_fffffffffffffef0;
  __normal_iterator<llama_token_data_*,_std::vector<llama_token_data,_std::allocator<llama_token_data>_>_>
  in_stack_fffffffffffffef8;
  __normal_iterator<llama_token_data_*,_std::vector<llama_token_data,_std::allocator<llama_token_data>_>_>
  __result;
  __normal_iterator<const_llama_token_data_*,_std::vector<llama_token_data,_std::allocator<llama_token_data>_>_>
  in_stack_ffffffffffffff00;
  llama_token_data *local_e0;
  size_type local_d8;
  undefined8 local_d0;
  undefined1 local_c8;
  llama_token_data *local_c0;
  llama_token_data *local_b8;
  llama_token_data *local_b0;
  llama_token_data *local_a8;
  int local_9c;
  vector<llama_token_data,_std::allocator<llama_token_data>_> *local_98;
  llama_token_data *local_90;
  size_type local_88;
  undefined8 local_80;
  undefined1 local_78;
  llama_token_data *local_70;
  llama_token_data *local_68;
  llama_token_data *local_60;
  llama_token_data *local_58;
  vector<llama_token_data,_std::allocator<llama_token_data>_> local_38;
  int local_1c;
  undefined8 local_10;
  undefined8 local_8;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  __first._M_current =
       (llama_token_data *)
       std::vector<llama_token_data,_std::allocator<llama_token_data>_>::size(in_RDX);
  std::allocator<llama_token_data>::allocator((allocator<llama_token_data> *)0x10e41a);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::vector
            ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)
             in_stack_ffffffffffffff00._M_current,(size_type)in_stack_fffffffffffffef8._M_current,
             in_stack_fffffffffffffef0);
  std::allocator<llama_token_data>::~allocator((allocator<llama_token_data> *)0x10e440);
  local_58 = (llama_token_data *)
             std::vector<llama_token_data,_std::allocator<llama_token_data>_>::begin
                       (in_stack_fffffffffffffed8);
  local_60 = (llama_token_data *)
             std::vector<llama_token_data,_std::allocator<llama_token_data>_>::end
                       (in_stack_fffffffffffffed8);
  local_68 = (llama_token_data *)
             std::vector<llama_token_data,_std::allocator<llama_token_data>_>::begin
                       (in_stack_fffffffffffffed8);
  __last = std::
           copy<__gnu_cxx::__normal_iterator<llama_token_data_const*,std::vector<llama_token_data,std::allocator<llama_token_data>>>,__gnu_cxx::__normal_iterator<llama_token_data*,std::vector<llama_token_data,std::allocator<llama_token_data>>>>
                     (__first,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  __result._M_current = (llama_token_data *)&local_38;
  local_70 = __last._M_current;
  local_90 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::data
                       ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x10e4c2);
  local_88 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::size
                       ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)
                        __result._M_current);
  local_80 = 0xffffffffffffffff;
  local_78 = 0;
  llama_sampler_apply(local_8,&local_90);
  llama_sampler_reset(local_8);
  this = (vector<llama_token_data,_std::allocator<llama_token_data>_> *)ggml_time_us();
  local_98 = this;
  for (local_9c = 0; local_9c < local_1c; local_9c = local_9c + 1) {
    local_a8 = (llama_token_data *)
               std::vector<llama_token_data,_std::allocator<llama_token_data>_>::begin
                         (in_stack_fffffffffffffed8);
    local_b0 = (llama_token_data *)
               std::vector<llama_token_data,_std::allocator<llama_token_data>_>::end
                         (in_stack_fffffffffffffed8);
    local_b8 = (llama_token_data *)
               std::vector<llama_token_data,_std::allocator<llama_token_data>_>::begin
                         (in_stack_fffffffffffffed8);
    local_c0 = (llama_token_data *)
               std::
               copy<__gnu_cxx::__normal_iterator<llama_token_data_const*,std::vector<llama_token_data,std::allocator<llama_token_data>>>,__gnu_cxx::__normal_iterator<llama_token_data*,std::vector<llama_token_data,std::allocator<llama_token_data>>>>
                         (__first,__last._M_current,__result);
    local_e0 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::data
                         ((vector<llama_token_data,_std::allocator<llama_token_data>_> *)0x10e5c1);
    local_d8 = std::vector<llama_token_data,_std::allocator<llama_token_data>_>::size(&local_38);
    local_d0 = 0xffffffffffffffff;
    local_c8 = 0;
    llama_sampler_apply(local_8,&local_e0);
    llama_sampler_reset(local_8);
  }
  lVar1 = ggml_time_us();
  llama_sampler_free(local_8);
  printf("%-43s: %8.3f us/iter\n",(double)((float)(lVar1 - (long)local_98) / (float)local_1c),
         local_10);
  std::vector<llama_token_data,_std::allocator<llama_token_data>_>::~vector(this);
  return;
}

Assistant:

static void bench(llama_sampler * cnstr, const char * cnstr_name, const std::vector<llama_token_data> & data, int n_iter) {
    std::vector<llama_token_data> cur(data.size());
    std::copy(data.begin(), data.end(), cur.begin());
    llama_token_data_array cur_p = { cur.data(), cur.size(), -1, false };
    llama_sampler_apply(cnstr, &cur_p);
    llama_sampler_reset(cnstr);
    const int64_t t_start = ggml_time_us();
    for (int i = 0; i < n_iter; i++) {
        std::copy(data.begin(), data.end(), cur.begin());
        llama_token_data_array cur_p = { cur.data(), cur.size(), -1, false };
        llama_sampler_apply(cnstr, &cur_p);
        llama_sampler_reset(cnstr);
    }
    const int64_t t_end = ggml_time_us();
    llama_sampler_free(cnstr);
    printf("%-43s: %8.3f us/iter\n", cnstr_name, (t_end - t_start) / (float)n_iter);
}